

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

void __thiscall APlayerPawn::GiveDeathmatchInventory(APlayerPawn *this)

{
  bool bVar1;
  uint uVar2;
  PClassActor **ppPVar3;
  AActor *pAVar4;
  AInventory *this_00;
  AKey *key;
  uint i;
  APlayerPawn *this_local;
  
  for (key._4_4_ = 0;
      uVar2 = TArray<PClassActor_*,_PClassActor_*>::Size(&PClassActor::AllActorClasses),
      key._4_4_ < uVar2; key._4_4_ = key._4_4_ + 1) {
    ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                        (&PClassActor::AllActorClasses,(ulong)key._4_4_);
    bVar1 = PClass::IsDescendantOf(&(*ppPVar3)->super_PClass,AKey::RegistrationInfo.MyClass);
    if (bVar1) {
      ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                          (&PClassActor::AllActorClasses,(ulong)key._4_4_);
      pAVar4 = GetDefaultByType(&(*ppPVar3)->super_PClass);
      if (*(char *)((long)&pAVar4[1].snext + 4) != '\0') {
        ppPVar3 = TArray<PClassActor_*,_PClassActor_*>::operator[]
                            (&PClassActor::AllActorClasses,(ulong)key._4_4_);
        this_00 = (AInventory *)Spawn(*ppPVar3);
        bVar1 = AInventory::CallTryPickup(this_00,&this->super_AActor,(AActor **)0x0);
        if (!bVar1) {
          (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])();
        }
      }
    }
  }
  return;
}

Assistant:

void APlayerPawn::GiveDeathmatchInventory()
{
	for (unsigned int i = 0; i < PClassActor::AllActorClasses.Size(); ++i)
	{
		if (PClassActor::AllActorClasses[i]->IsDescendantOf (RUNTIME_CLASS(AKey)))
		{
			AKey *key = (AKey *)GetDefaultByType (PClassActor::AllActorClasses[i]);
			if (key->KeyNumber != 0)
			{
				key = static_cast<AKey *>(Spawn(static_cast<PClassActor *>(PClassActor::AllActorClasses[i])));
				if (!key->CallTryPickup (this))
				{
					key->Destroy ();
				}
			}
		}
	}
}